

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

double insphereexact(double *pa,double *pb,double *pc,double *pd,double *pe)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dStack_2c390;
  double dStack_2c380;
  double dStack_2c370;
  double dStack_2c350;
  double dStack_2c348;
  double dStack_2c330;
  double dStack_2c300;
  double dStack_2c210;
  undefined1 auStack_2c1f8 [16];
  double dStack_2c1e8;
  double dStack_2c1e0;
  undefined1 auStack_2c1d8 [16];
  double dStack_2c1c8;
  double dStack_2c1c0;
  undefined1 auStack_2c1b8 [16];
  double dStack_2c1a8;
  double dStack_2c1a0;
  undefined1 auStack_2c198 [16];
  double dStack_2c188;
  double dStack_2c180;
  double dStack_2c178;
  double dStack_2c170;
  double dStack_2c168;
  double dStack_2c160;
  undefined1 auStack_2c158 [16];
  double dStack_2c148;
  double dStack_2c140;
  undefined1 auStack_2c138 [16];
  double dStack_2c128;
  double dStack_2c120;
  double dStack_2c118;
  double dStack_2c110;
  double dStack_2c108;
  double dStack_2c100;
  double dStack_2c0f8;
  double dStack_2c0f0;
  double dStack_2c0e8;
  double dStack_2c0e0;
  double dStack_2c0d8;
  double dStack_2c0d0;
  double dStack_2c0c8;
  double dStack_2c0c0;
  double temp48b [48];
  double temp48a [48];
  double eac [24];
  double deb [24];
  double cda [24];
  double bce [24];
  double abd [24];
  double eab [24];
  double dea [24];
  double cde [24];
  double bcd [24];
  double abc [24];
  double temp8b [8];
  double temp8a [8];
  double temp16 [16];
  double det384x [384];
  double temp192 [192];
  double det384z [384];
  double det384y [384];
  double eabc [96];
  double deab [96];
  double cdea [96];
  double bcde [96];
  double abcd [96];
  double detxy [768];
  double ddet [1152];
  double cdet [1152];
  double bdet [1152];
  double adet [1152];
  double edet [1152];
  double cddet [2304];
  double abdet [2304];
  double deter [5760];
  double cdedet [3456];
  
  dVar40 = *pb;
  dVar43 = pb[1];
  dVar12 = *pa;
  dVar13 = pa[1];
  auVar14 = *(undefined1 (*) [16])pa;
  dVar36 = dVar43 * dVar12;
  dVar53 = dVar40 * dVar13;
  dVar8 = splitter * dVar43 - (splitter * dVar43 - dVar43);
  dVar11 = splitter * dVar40 - (splitter * dVar40 - dVar40);
  dVar58 = dVar43 - dVar8;
  dVar60 = dVar40 - dVar11;
  dVar31 = splitter * dVar12 - (splitter * dVar12 - dVar12);
  dVar34 = splitter * dVar13 - (splitter * dVar13 - dVar13);
  dVar38 = dVar12 - dVar31;
  dVar41 = dVar13 - dVar34;
  dVar39 = dVar58 * dVar38 - (((dVar36 - dVar31 * dVar8) - dVar38 * dVar8) - dVar58 * dVar31);
  dVar42 = dVar60 * dVar41 - (((dVar53 - dVar11 * dVar34) - dVar60 * dVar34) - dVar41 * dVar11);
  dVar44 = dVar39 - dVar42;
  dVar32 = dVar36 + dVar44;
  dVar36 = (dVar36 - (dVar32 - (dVar32 - dVar36))) + (dVar44 - (dVar32 - dVar36));
  dVar37 = dVar36 - dVar53;
  dVar31 = -dVar31;
  dVar11 = -dVar11;
  dStack_2c178 = (dVar39 - (dVar44 + (dVar39 - dVar44))) + ((dVar39 - dVar44) - dVar42);
  dStack_2c170 = (dVar36 - (dVar37 + (dVar36 - dVar37))) + ((dVar36 - dVar37) - dVar53);
  dStack_2c160 = dVar32 + dVar37;
  dStack_2c168 = (dVar32 - (dStack_2c160 - (dStack_2c160 - dVar32))) +
                 (dVar37 - (dStack_2c160 - dVar32));
  dVar46 = *pc;
  dVar33 = pc[1];
  dVar42 = splitter * dVar46 - (splitter * dVar46 - dVar46);
  dVar61 = splitter * dVar33 - (splitter * dVar33 - dVar33);
  auVar1 = *(undefined1 (*) [16])pd;
  dVar37 = auVar1._0_8_;
  dVar39 = auVar1._8_8_;
  auVar3._8_4_ = auVar1._0_4_;
  auVar3._0_8_ = dVar39;
  auVar3._12_4_ = auVar1._4_4_;
  dVar45 = splitter * dVar39 - (splitter * dVar39 - dVar39);
  dVar47 = splitter * dVar37 - (splitter * dVar37 - dVar37);
  dVar9 = -dVar42;
  auVar6._8_4_ = SUB84(dVar47,0);
  auVar6._0_8_ = dVar9;
  auVar6._12_4_ = (uint)((ulong)dVar47 >> 0x20) ^ 0x80000000;
  dVar10 = dVar46 - dVar42;
  dVar35 = dVar33 - dVar61;
  dVar48 = dVar39 - dVar45;
  dVar37 = dVar37 - dVar47;
  dVar36 = -dVar38;
  auVar1._8_4_ = SUB84(dVar60,0);
  auVar1._0_8_ = dVar36;
  auVar1._12_4_ = (int)((ulong)-dVar60 >> 0x20);
  dVar50 = -dVar10;
  dVar52 = -dVar37;
  dVar51 = dVar43 * dVar46;
  dVar53 = dVar40 * dVar33;
  dStack_2c380 = auVar6._8_8_;
  auVar7._8_4_ = SUB84(dVar35,0);
  auVar7._0_8_ = dVar10;
  auVar7._12_4_ = (int)((ulong)dVar35 >> 0x20);
  dVar54 = dVar58 * dVar10 - (dVar9 * dVar58 + dVar50 * dVar8 + dVar9 * dVar8 + dVar51);
  dVar55 = dVar60 * dVar35 - (dVar35 * dVar11 + dVar61 * -dVar60 + dVar61 * dVar11 + dVar53);
  dVar59 = dVar55 - dVar54;
  dVar44 = dVar53 + dVar59;
  dVar53 = (dVar53 - (dVar44 - (dVar44 - dVar53))) + (dVar59 - (dVar44 - dVar53));
  dVar32 = dVar53 - dVar51;
  dStack_2c0d8 = (dVar55 - (dVar59 + (dVar55 - dVar59))) + ((dVar55 - dVar59) - dVar54);
  dStack_2c0d0 = (dVar53 - ((dVar53 - dVar32) + dVar32)) + ((dVar53 - dVar32) - dVar51);
  dStack_2c0c0 = dVar44 + dVar32;
  dStack_2c0c8 = (dVar44 - (dStack_2c0c0 - (dStack_2c0c0 - dVar44))) +
                 (dVar32 - (dStack_2c0c0 - dVar44));
  dStack_2c370 = auVar3._8_8_;
  dVar53 = dVar46 * dVar39;
  dVar51 = dVar33 * dStack_2c370;
  dVar44 = dVar10 * dVar48 - (((dVar53 - dVar42 * dVar45) - dVar45 * dVar10) - dVar48 * dVar42);
  dVar35 = dVar35 * dVar37 - (((dVar51 - dVar47 * dVar61) - dVar61 * dVar37) - dVar35 * dVar47);
  dVar47 = dVar44 - dVar35;
  dVar42 = dVar53 + dVar47;
  dVar53 = (dVar53 - (dVar42 - (dVar42 - dVar53))) + (dVar47 - (dVar42 - dVar53));
  dVar32 = dVar53 - dVar51;
  dVar53 = (dVar53 - (dVar32 + (dVar53 - dVar32))) + ((dVar53 - dVar32) - dVar51);
  auStack_2c198._8_4_ = SUB84(dVar53,0);
  auStack_2c198._0_8_ = (dVar44 - (dVar47 + (dVar44 - dVar47))) + ((dVar44 - dVar47) - dVar35);
  auStack_2c198._12_4_ = (int)((ulong)dVar53 >> 0x20);
  dStack_2c180 = dVar42 + dVar32;
  dStack_2c188 = (dVar42 - (dStack_2c180 - (dStack_2c180 - dVar42))) +
                 (dVar32 - (dStack_2c180 - dVar42));
  dVar51 = *pe;
  dVar54 = pe[1];
  dVar53 = splitter * dVar51 - (splitter * dVar51 - dVar51);
  dVar32 = splitter * dVar54 - (splitter * dVar54 - dVar54);
  dVar44 = -dVar53;
  dVar56 = dVar51 - dVar53;
  dVar57 = dVar54 - dVar32;
  dVar62 = -dVar56;
  auVar4._8_4_ = SUB84(dVar32,0);
  auVar4._0_8_ = dVar53;
  auVar4._12_4_ = (int)((ulong)dVar32 >> 0x20);
  dVar53 = dVar39 * dVar51;
  dVar42 = dStack_2c370 * dVar54;
  dVar59 = dVar48 * dVar56 - (dVar44 * dVar48 + dVar62 * dVar45 + dVar44 * dVar45 + dVar53);
  dVar49 = dVar37 * dVar57 -
           (dVar57 * dStack_2c380 + dVar32 * dVar52 + dVar32 * dStack_2c380 + dVar42);
  dVar55 = dVar49 - dVar59;
  dVar47 = dVar42 + dVar55;
  dVar42 = (dVar42 - (dVar47 - (dVar47 - dVar42))) + (dVar55 - (dVar47 - dVar42));
  dVar35 = dVar42 - dVar53;
  dVar53 = (dVar42 - ((dVar42 - dVar35) + dVar35)) + ((dVar42 - dVar35) - dVar53);
  auStack_2c1b8._8_4_ = SUB84(dVar53,0);
  auStack_2c1b8._0_8_ = (dVar49 - (dVar55 + (dVar49 - dVar55))) + ((dVar49 - dVar55) - dVar59);
  auStack_2c1b8._12_4_ = (int)((ulong)dVar53 >> 0x20);
  dStack_2c1a0 = dVar47 + dVar35;
  dStack_2c1a8 = (dVar47 - (dStack_2c1a0 - (dStack_2c1a0 - dVar47))) +
                 (dVar35 - (dStack_2c1a0 - dVar47));
  dVar35 = dVar13 * dVar51;
  dVar59 = dVar12 * dVar54;
  dStack_2c210 = auVar7._8_8_;
  auVar2._8_4_ = SUB84(dVar37 * dVar41,0);
  auVar2._0_8_ = dVar48 * dVar38;
  auVar2._12_4_ = (int)((ulong)(dVar37 * dVar41) >> 0x20);
  dVar53 = dVar41 * dVar56 - (dVar41 * dVar44 + dVar62 * dVar34 + dVar44 * dVar34 + dVar35);
  dVar32 = dVar38 * dVar57 - (dVar57 * dVar31 + dVar36 * dVar32 + dVar31 * dVar32 + dVar59);
  dVar42 = dVar53 - dVar32;
  dVar55 = dVar35 + dVar42;
  dVar35 = (dVar35 - (dVar55 - (dVar55 - dVar35))) + (dVar42 - (dVar55 - dVar35));
  dVar47 = dVar35 - dVar59;
  dStack_2c0f8 = (dVar53 - (dVar42 + (dVar53 - dVar42))) + ((dVar53 - dVar42) - dVar32);
  dStack_2c0f0 = (dVar35 - (dVar47 + (dVar35 - dVar47))) + ((dVar35 - dVar47) - dVar59);
  dStack_2c0e0 = dVar55 + dVar47;
  dStack_2c0e8 = (dVar55 - (dStack_2c0e0 - (dStack_2c0e0 - dVar55))) +
                 (dVar47 - (dStack_2c0e0 - dVar55));
  dVar42 = dVar43 * dVar51;
  auVar5._8_4_ = SUB84(dVar40 * dVar54,0);
  auVar5._0_8_ = dVar42;
  auVar5._12_4_ = (int)((ulong)(dVar40 * dVar54) >> 0x20);
  dVar54 = dVar54 * dVar46;
  dVar51 = dVar51 * dVar33;
  dVar33 = dVar33 * dVar12;
  dVar46 = dVar46 * dVar13;
  dVar47 = dStack_2c210 * dVar38 -
           (dStack_2c210 * dVar31 + dVar36 * dVar61 + dVar31 * dVar61 + dVar33);
  dVar55 = dVar10 * dVar41 - (dVar41 * dVar9 + dVar50 * dVar34 + dVar9 * dVar34 + dVar46);
  dVar35 = dVar47 - dVar55;
  dVar53 = dVar33 + dVar35;
  dVar32 = (dVar33 - (dVar53 - (dVar53 - dVar33))) + (dVar35 - (dVar53 - dVar33));
  dVar33 = dVar32 - dVar46;
  dStack_2c118 = (dVar47 - (dVar35 + (dVar47 - dVar35))) + ((dVar47 - dVar35) - dVar55);
  dStack_2c110 = (dVar32 - (dVar33 + (dVar32 - dVar33))) + ((dVar32 - dVar33) - dVar46);
  dStack_2c100 = dVar53 + dVar33;
  dStack_2c108 = (dVar53 - (dStack_2c100 - (dStack_2c100 - dVar53))) +
                 (dVar33 - (dStack_2c100 - dVar53));
  dStack_2c300 = auVar1._8_8_;
  dVar40 = dVar40 * dVar39;
  dVar43 = dVar43 * dStack_2c370;
  dVar46 = dVar60 * dVar48 - (dVar48 * dVar11 + dStack_2c300 * dVar45 + dVar11 * dVar45 + dVar40);
  dVar35 = dVar58 * dVar37 -
           (dVar58 * dStack_2c380 + dVar52 * dVar8 + dStack_2c380 * dVar8 + dVar43);
  dVar32 = dVar46 - dVar35;
  dVar53 = dVar40 + dVar32;
  dVar37 = (dVar40 - (dVar53 - (dVar53 - dVar40))) + (dVar32 - (dVar53 - dVar40));
  dVar33 = dVar37 - dVar43;
  dVar37 = (dVar37 - (dVar33 + (dVar37 - dVar33))) + ((dVar37 - dVar33) - dVar43);
  auStack_2c138._8_4_ = SUB84(dVar37,0);
  auStack_2c138._0_8_ = (dVar46 - (dVar32 + (dVar46 - dVar32))) + ((dVar46 - dVar32) - dVar35);
  auStack_2c138._12_4_ = (int)((ulong)dVar37 >> 0x20);
  dStack_2c120 = dVar53 + dVar33;
  dStack_2c128 = (dVar53 - (dStack_2c120 - (dStack_2c120 - dVar53))) +
                 (dVar33 - (dStack_2c120 - dVar53));
  dStack_2c330 = auVar4._8_8_;
  dVar46 = dVar57 * dVar10 -
           (dVar57 * dVar9 + dVar50 * dStack_2c330 + dVar9 * dStack_2c330 + dVar54);
  dVar61 = dVar56 * dStack_2c210 -
           (dStack_2c210 * dVar44 + dVar62 * dVar61 + dVar44 * dVar61 + dVar51);
  dVar32 = dVar46 - dVar61;
  dVar53 = dVar54 + dVar32;
  dVar37 = (dVar54 - (dVar53 - (dVar53 - dVar54))) + (dVar32 - (dVar53 - dVar54));
  dVar33 = dVar37 - dVar51;
  dVar37 = (dVar37 - (dVar33 + (dVar37 - dVar33))) + ((dVar37 - dVar33) - dVar51);
  auStack_2c1d8._8_4_ = SUB84(dVar37,0);
  auStack_2c1d8._0_8_ = (dVar46 - (dVar32 + (dVar46 - dVar32))) + ((dVar46 - dVar32) - dVar61);
  auStack_2c1d8._12_4_ = (int)((ulong)dVar37 >> 0x20);
  dStack_2c1c0 = dVar53 + dVar33;
  dStack_2c1c8 = (dVar53 - (dStack_2c1c0 - (dStack_2c1c0 - dVar53))) +
                 (dVar33 - (dStack_2c1c0 - dVar53));
  dVar39 = dVar39 * dVar12;
  dStack_2c370 = dStack_2c370 * dVar13;
  dStack_2c390 = auVar2._8_8_;
  dVar36 = dVar48 * dVar38 - (dVar48 * dVar31 + dVar36 * dVar45 + dVar31 * dVar45 + dVar39);
  dStack_2c390 = dStack_2c390 -
                 (dVar41 * dStack_2c380 + dVar52 * dVar34 + dStack_2c380 * dVar34 + dStack_2c370);
  dVar31 = dStack_2c390 - dVar36;
  dVar37 = dStack_2c370 + dVar31;
  dVar53 = (dStack_2c370 - (dVar37 - (dVar37 - dStack_2c370))) + (dVar31 - (dVar37 - dStack_2c370));
  dVar32 = dVar53 - dVar39;
  dVar53 = (dVar53 - ((dVar53 - dVar32) + dVar32)) + ((dVar53 - dVar32) - dVar39);
  auStack_2c158._8_4_ = SUB84(dVar53,0);
  auStack_2c158._0_8_ =
       (dStack_2c390 - (dVar31 + (dStack_2c390 - dVar31))) + ((dStack_2c390 - dVar31) - dVar36);
  auStack_2c158._12_4_ = (int)((ulong)dVar53 >> 0x20);
  dStack_2c140 = dVar37 + dVar32;
  dStack_2c148 = (dVar37 - (dStack_2c140 - (dStack_2c140 - dVar37))) +
                 (dVar32 - (dStack_2c140 - dVar37));
  dStack_2c350 = auVar5._8_8_;
  dVar39 = dVar56 * dVar58 - (dVar58 * dVar44 + dVar62 * dVar8 + dVar44 * dVar8 + dVar42);
  dVar31 = dVar57 * dVar60 -
           (dVar57 * dVar11 + dStack_2c300 * dStack_2c330 + dVar11 * dStack_2c330 + dStack_2c350);
  dVar37 = dVar39 - dVar31;
  dVar36 = dVar42 + dVar37;
  dVar53 = (dVar42 - (dVar36 - (dVar36 - dVar42))) + (dVar37 - (dVar36 - dVar42));
  dVar32 = dVar53 - dStack_2c350;
  dVar53 = (dVar53 - (dVar32 + (dVar53 - dVar32))) + ((dVar53 - dVar32) - dStack_2c350);
  auStack_2c1f8._8_4_ = SUB84(dVar53,0);
  auStack_2c1f8._0_8_ = (dVar39 - (dVar37 + (dVar39 - dVar37))) + ((dVar39 - dVar37) - dVar31);
  auStack_2c1f8._12_4_ = (int)((ulong)dVar53 >> 0x20);
  dStack_2c1e0 = dVar36 + dVar32;
  dStack_2c1e8 = (dVar36 - (dStack_2c1e0 - (dStack_2c1e0 - dVar36))) +
                 (dVar32 - (dStack_2c1e0 - dVar36));
  dVar36 = pa[2];
  iVar15 = scale_expansion_zeroelim(4,&dStack_2c0d8,dVar36,temp8a);
  dVar53 = pb[2];
  iVar16 = scale_expansion_zeroelim(4,&dStack_2c118,-dVar53,temp8b);
  iVar15 = fast_expansion_sum_zeroelim(iVar15,temp8a,iVar16,temp8b,temp16);
  dVar32 = pc[2];
  iVar16 = scale_expansion_zeroelim(4,&dStack_2c178,dVar32,temp8a);
  iVar15 = fast_expansion_sum_zeroelim(iVar16,temp8a,iVar15,temp16,abc);
  iVar16 = scale_expansion_zeroelim(4,(double *)auStack_2c198,dVar53,temp8a);
  iVar17 = scale_expansion_zeroelim(4,(double *)auStack_2c138,-dVar32,temp8b);
  iVar16 = fast_expansion_sum_zeroelim(iVar16,temp8a,iVar17,temp8b,temp16);
  dVar37 = pd[2];
  iVar17 = scale_expansion_zeroelim(4,&dStack_2c0d8,dVar37,temp8a);
  iVar16 = fast_expansion_sum_zeroelim(iVar17,temp8a,iVar16,temp16,bcd);
  iVar17 = scale_expansion_zeroelim(4,(double *)auStack_2c1b8,dVar32,temp8a);
  iVar18 = scale_expansion_zeroelim(4,(double *)auStack_2c1d8,-dVar37,temp8b);
  iVar17 = fast_expansion_sum_zeroelim(iVar17,temp8a,iVar18,temp8b,temp16);
  dVar39 = pe[2];
  iVar18 = scale_expansion_zeroelim(4,(double *)auStack_2c198,dVar39,temp8a);
  iVar17 = fast_expansion_sum_zeroelim(iVar18,temp8a,iVar17,temp16,cde);
  iVar18 = scale_expansion_zeroelim(4,&dStack_2c0f8,dVar37,temp8a);
  iVar19 = scale_expansion_zeroelim(4,(double *)auStack_2c158,-dVar39,temp8b);
  iVar18 = fast_expansion_sum_zeroelim(iVar18,temp8a,iVar19,temp8b,temp16);
  iVar19 = scale_expansion_zeroelim(4,(double *)auStack_2c1b8,dVar36,temp8a);
  iVar18 = fast_expansion_sum_zeroelim(iVar19,temp8a,iVar18,temp16,dea);
  iVar19 = scale_expansion_zeroelim(4,&dStack_2c178,dVar39,temp8a);
  iVar20 = scale_expansion_zeroelim(4,(double *)auStack_2c1f8,-dVar36,temp8b);
  iVar19 = fast_expansion_sum_zeroelim(iVar19,temp8a,iVar20,temp8b,temp16);
  iVar20 = scale_expansion_zeroelim(4,&dStack_2c0f8,dVar53,temp8a);
  iVar19 = fast_expansion_sum_zeroelim(iVar20,temp8a,iVar19,temp16,eab);
  iVar20 = scale_expansion_zeroelim(4,(double *)auStack_2c138,dVar36,temp8a);
  iVar21 = scale_expansion_zeroelim(4,(double *)auStack_2c158,dVar53,temp8b);
  iVar20 = fast_expansion_sum_zeroelim(iVar20,temp8a,iVar21,temp8b,temp16);
  iVar21 = scale_expansion_zeroelim(4,&dStack_2c178,dVar37,temp8a);
  iVar20 = fast_expansion_sum_zeroelim(iVar21,temp8a,iVar20,temp16,abd);
  iVar21 = scale_expansion_zeroelim(4,(double *)auStack_2c1d8,dVar53,temp8a);
  iVar22 = scale_expansion_zeroelim(4,(double *)auStack_2c1f8,dVar32,temp8b);
  iVar21 = fast_expansion_sum_zeroelim(iVar21,temp8a,iVar22,temp8b,temp16);
  iVar22 = scale_expansion_zeroelim(4,&dStack_2c0d8,dVar39,temp8a);
  iVar21 = fast_expansion_sum_zeroelim(iVar22,temp8a,iVar21,temp16,bce);
  iVar22 = scale_expansion_zeroelim(4,(double *)auStack_2c158,dVar32,temp8a);
  iVar23 = scale_expansion_zeroelim(4,&dStack_2c118,dVar37,temp8b);
  iVar22 = fast_expansion_sum_zeroelim(iVar22,temp8a,iVar23,temp8b,temp16);
  iVar23 = scale_expansion_zeroelim(4,(double *)auStack_2c198,dVar36,temp8a);
  iVar22 = fast_expansion_sum_zeroelim(iVar23,temp8a,iVar22,temp16,cda);
  iVar23 = scale_expansion_zeroelim(4,(double *)auStack_2c1f8,dVar37,temp8a);
  iVar24 = scale_expansion_zeroelim(4,(double *)auStack_2c138,dVar39,temp8b);
  iVar23 = fast_expansion_sum_zeroelim(iVar23,temp8a,iVar24,temp8b,temp16);
  iVar24 = scale_expansion_zeroelim(4,(double *)auStack_2c1b8,dVar53,temp8a);
  iVar23 = fast_expansion_sum_zeroelim(iVar24,temp8a,iVar23,temp16,deb);
  iVar24 = scale_expansion_zeroelim(4,&dStack_2c118,dVar39,temp8a);
  iVar25 = scale_expansion_zeroelim(4,(double *)auStack_2c1d8,dVar36,temp8b);
  iVar24 = fast_expansion_sum_zeroelim(iVar24,temp8a,iVar25,temp8b,temp16);
  iVar25 = scale_expansion_zeroelim(4,&dStack_2c0f8,dVar32,temp8a);
  iVar24 = fast_expansion_sum_zeroelim(iVar25,temp8a,iVar24,temp16,eac);
  iVar25 = fast_expansion_sum_zeroelim(iVar17,cde,iVar21,bce,temp48a);
  uVar26 = fast_expansion_sum_zeroelim(iVar23,deb,iVar16,bcd,temp48b);
  uVar29 = 0;
  uVar30 = (ulong)uVar26;
  if ((int)uVar26 < 1) {
    uVar30 = uVar29;
  }
  for (; uVar30 != uVar29; uVar29 = uVar29 + 1) {
    temp48b[uVar29] = -temp48b[uVar29];
  }
  iVar25 = fast_expansion_sum_zeroelim(iVar25,temp48a,uVar26,temp48b,bcde);
  dStack_2c348 = auVar14._0_8_;
  iVar27 = scale_expansion_zeroelim(iVar25,bcde,dStack_2c348,temp192);
  iVar27 = scale_expansion_zeroelim(iVar27,temp192,dStack_2c348,det384x);
  dVar31 = auVar14._8_8_;
  iVar28 = scale_expansion_zeroelim(iVar25,bcde,dVar31,temp192);
  iVar28 = scale_expansion_zeroelim(iVar28,temp192,dVar31,det384y);
  iVar25 = scale_expansion_zeroelim(iVar25,bcde,dVar36,temp192);
  iVar25 = scale_expansion_zeroelim(iVar25,temp192,dVar36,det384z);
  iVar27 = fast_expansion_sum_zeroelim(iVar27,det384x,iVar28,det384y,detxy);
  iVar25 = fast_expansion_sum_zeroelim(iVar27,detxy,iVar25,det384z,adet);
  iVar27 = fast_expansion_sum_zeroelim(iVar18,dea,iVar22,cda,temp48a);
  uVar26 = fast_expansion_sum_zeroelim(iVar24,eac,iVar17,cde,temp48b);
  uVar29 = 0;
  uVar30 = (ulong)uVar26;
  if ((int)uVar26 < 1) {
    uVar30 = uVar29;
  }
  for (; uVar30 != uVar29; uVar29 = uVar29 + 1) {
    temp48b[uVar29] = -temp48b[uVar29];
  }
  iVar17 = fast_expansion_sum_zeroelim(iVar27,temp48a,uVar26,temp48b,cdea);
  dVar36 = *pb;
  iVar27 = scale_expansion_zeroelim(iVar17,cdea,dVar36,temp192);
  iVar27 = scale_expansion_zeroelim(iVar27,temp192,dVar36,det384x);
  dVar36 = pb[1];
  iVar28 = scale_expansion_zeroelim(iVar17,cdea,dVar36,temp192);
  iVar28 = scale_expansion_zeroelim(iVar28,temp192,dVar36,det384y);
  iVar17 = scale_expansion_zeroelim(iVar17,cdea,dVar53,temp192);
  iVar17 = scale_expansion_zeroelim(iVar17,temp192,dVar53,det384z);
  iVar27 = fast_expansion_sum_zeroelim(iVar27,det384x,iVar28,det384y,detxy);
  iVar17 = fast_expansion_sum_zeroelim(iVar27,detxy,iVar17,det384z,bdet);
  iVar23 = fast_expansion_sum_zeroelim(iVar19,eab,iVar23,deb,temp48a);
  uVar26 = fast_expansion_sum_zeroelim(iVar20,abd,iVar18,dea,temp48b);
  uVar29 = 0;
  uVar30 = (ulong)uVar26;
  if ((int)uVar26 < 1) {
    uVar30 = uVar29;
  }
  for (; uVar30 != uVar29; uVar29 = uVar29 + 1) {
    temp48b[uVar29] = -temp48b[uVar29];
  }
  iVar18 = fast_expansion_sum_zeroelim(iVar23,temp48a,uVar26,temp48b,deab);
  dVar36 = *pc;
  iVar23 = scale_expansion_zeroelim(iVar18,deab,dVar36,temp192);
  iVar23 = scale_expansion_zeroelim(iVar23,temp192,dVar36,det384x);
  dVar36 = pc[1];
  iVar27 = scale_expansion_zeroelim(iVar18,deab,dVar36,temp192);
  iVar27 = scale_expansion_zeroelim(iVar27,temp192,dVar36,det384y);
  iVar18 = scale_expansion_zeroelim(iVar18,deab,dVar32,temp192);
  iVar18 = scale_expansion_zeroelim(iVar18,temp192,dVar32,det384z);
  iVar23 = fast_expansion_sum_zeroelim(iVar23,det384x,iVar27,det384y,detxy);
  iVar18 = fast_expansion_sum_zeroelim(iVar23,detxy,iVar18,det384z,cdet);
  iVar23 = fast_expansion_sum_zeroelim(iVar15,abc,iVar24,eac,temp48a);
  uVar26 = fast_expansion_sum_zeroelim(iVar21,bce,iVar19,eab,temp48b);
  uVar29 = 0;
  uVar30 = (ulong)uVar26;
  if ((int)uVar26 < 1) {
    uVar30 = uVar29;
  }
  for (; uVar30 != uVar29; uVar29 = uVar29 + 1) {
    temp48b[uVar29] = -temp48b[uVar29];
  }
  iVar19 = fast_expansion_sum_zeroelim(iVar23,temp48a,uVar26,temp48b,eabc);
  dVar36 = *pd;
  iVar21 = scale_expansion_zeroelim(iVar19,eabc,dVar36,temp192);
  iVar21 = scale_expansion_zeroelim(iVar21,temp192,dVar36,det384x);
  dVar36 = pd[1];
  iVar23 = scale_expansion_zeroelim(iVar19,eabc,dVar36,temp192);
  iVar23 = scale_expansion_zeroelim(iVar23,temp192,dVar36,det384y);
  iVar19 = scale_expansion_zeroelim(iVar19,eabc,dVar37,temp192);
  iVar19 = scale_expansion_zeroelim(iVar19,temp192,dVar37,det384z);
  iVar21 = fast_expansion_sum_zeroelim(iVar21,det384x,iVar23,det384y,detxy);
  iVar19 = fast_expansion_sum_zeroelim(iVar21,detxy,iVar19,det384z,ddet);
  iVar16 = fast_expansion_sum_zeroelim(iVar16,bcd,iVar20,abd,temp48a);
  uVar26 = fast_expansion_sum_zeroelim(iVar22,cda,iVar15,abc,temp48b);
  uVar29 = 0;
  uVar30 = (ulong)uVar26;
  if ((int)uVar26 < 1) {
    uVar30 = uVar29;
  }
  for (; uVar30 != uVar29; uVar29 = uVar29 + 1) {
    temp48b[uVar29] = -temp48b[uVar29];
  }
  iVar15 = fast_expansion_sum_zeroelim(iVar16,temp48a,uVar26,temp48b,abcd);
  dVar36 = *pe;
  iVar16 = scale_expansion_zeroelim(iVar15,abcd,dVar36,temp192);
  iVar16 = scale_expansion_zeroelim(iVar16,temp192,dVar36,det384x);
  dVar36 = pe[1];
  iVar20 = scale_expansion_zeroelim(iVar15,abcd,dVar36,temp192);
  iVar20 = scale_expansion_zeroelim(iVar20,temp192,dVar36,det384y);
  iVar15 = scale_expansion_zeroelim(iVar15,abcd,dVar39,temp192);
  iVar15 = scale_expansion_zeroelim(iVar15,temp192,dVar39,det384z);
  iVar16 = fast_expansion_sum_zeroelim(iVar16,det384x,iVar20,det384y,detxy);
  iVar15 = fast_expansion_sum_zeroelim(iVar16,detxy,iVar15,det384z,edet);
  iVar16 = fast_expansion_sum_zeroelim(iVar25,adet,iVar17,bdet,abdet);
  iVar17 = fast_expansion_sum_zeroelim(iVar18,cdet,iVar19,ddet,cddet);
  iVar15 = fast_expansion_sum_zeroelim(iVar17,cddet,iVar15,edet,cdedet);
  iVar15 = fast_expansion_sum_zeroelim(iVar16,abdet,iVar15,cdedet,deter);
  return abdet[(long)iVar15 + 0x8ff];
}

Assistant:

REAL insphereexact(REAL *pa, REAL *pb, REAL *pc, REAL *pd, REAL *pe)
{
  INEXACT REAL axby1, bxcy1, cxdy1, dxey1, exay1;
  INEXACT REAL bxay1, cxby1, dxcy1, exdy1, axey1;
  INEXACT REAL axcy1, bxdy1, cxey1, dxay1, exby1;
  INEXACT REAL cxay1, dxby1, excy1, axdy1, bxey1;
  REAL axby0, bxcy0, cxdy0, dxey0, exay0;
  REAL bxay0, cxby0, dxcy0, exdy0, axey0;
  REAL axcy0, bxdy0, cxey0, dxay0, exby0;
  REAL cxay0, dxby0, excy0, axdy0, bxey0;
  REAL ab[4], bc[4], cd[4], de[4], ea[4];
  REAL ac[4], bd[4], ce[4], da[4], eb[4];
  REAL temp8a[8], temp8b[8], temp16[16];
  int temp8alen, temp8blen, temp16len;
  REAL abc[24], bcd[24], cde[24], dea[24], eab[24];
  REAL abd[24], bce[24], cda[24], deb[24], eac[24];
  int abclen, bcdlen, cdelen, dealen, eablen;
  int abdlen, bcelen, cdalen, deblen, eaclen;
  REAL temp48a[48], temp48b[48];
  int temp48alen, temp48blen;
  REAL abcd[96], bcde[96], cdea[96], deab[96], eabc[96];
  int abcdlen, bcdelen, cdealen, deablen, eabclen;
  REAL temp192[192];
  REAL det384x[384], det384y[384], det384z[384];
  int xlen, ylen, zlen;
  REAL detxy[768];
  int xylen;
  REAL adet[1152], bdet[1152], cdet[1152], ddet[1152], edet[1152];
  int alen, blen, clen, dlen, elen;
  REAL abdet[2304], cddet[2304], cdedet[3456];
  int ablen, cdlen;
  REAL deter[5760];
  int deterlen;
  int i;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;


  Two_Product(pa[0], pb[1], axby1, axby0);
  Two_Product(pb[0], pa[1], bxay1, bxay0);
  Two_Two_Diff(axby1, axby0, bxay1, bxay0, ab[3], ab[2], ab[1], ab[0]);

  Two_Product(pb[0], pc[1], bxcy1, bxcy0);
  Two_Product(pc[0], pb[1], cxby1, cxby0);
  Two_Two_Diff(bxcy1, bxcy0, cxby1, cxby0, bc[3], bc[2], bc[1], bc[0]);

  Two_Product(pc[0], pd[1], cxdy1, cxdy0);
  Two_Product(pd[0], pc[1], dxcy1, dxcy0);
  Two_Two_Diff(cxdy1, cxdy0, dxcy1, dxcy0, cd[3], cd[2], cd[1], cd[0]);

  Two_Product(pd[0], pe[1], dxey1, dxey0);
  Two_Product(pe[0], pd[1], exdy1, exdy0);
  Two_Two_Diff(dxey1, dxey0, exdy1, exdy0, de[3], de[2], de[1], de[0]);

  Two_Product(pe[0], pa[1], exay1, exay0);
  Two_Product(pa[0], pe[1], axey1, axey0);
  Two_Two_Diff(exay1, exay0, axey1, axey0, ea[3], ea[2], ea[1], ea[0]);

  Two_Product(pa[0], pc[1], axcy1, axcy0);
  Two_Product(pc[0], pa[1], cxay1, cxay0);
  Two_Two_Diff(axcy1, axcy0, cxay1, cxay0, ac[3], ac[2], ac[1], ac[0]);

  Two_Product(pb[0], pd[1], bxdy1, bxdy0);
  Two_Product(pd[0], pb[1], dxby1, dxby0);
  Two_Two_Diff(bxdy1, bxdy0, dxby1, dxby0, bd[3], bd[2], bd[1], bd[0]);

  Two_Product(pc[0], pe[1], cxey1, cxey0);
  Two_Product(pe[0], pc[1], excy1, excy0);
  Two_Two_Diff(cxey1, cxey0, excy1, excy0, ce[3], ce[2], ce[1], ce[0]);

  Two_Product(pd[0], pa[1], dxay1, dxay0);
  Two_Product(pa[0], pd[1], axdy1, axdy0);
  Two_Two_Diff(dxay1, dxay0, axdy1, axdy0, da[3], da[2], da[1], da[0]);

  Two_Product(pe[0], pb[1], exby1, exby0);
  Two_Product(pb[0], pe[1], bxey1, bxey0);
  Two_Two_Diff(exby1, exby0, bxey1, bxey0, eb[3], eb[2], eb[1], eb[0]);

  temp8alen = scale_expansion_zeroelim(4, bc, pa[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, -pb[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ab, pc[2], temp8a);
  abclen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       abc);

  temp8alen = scale_expansion_zeroelim(4, cd, pb[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, -pc[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, bc, pd[2], temp8a);
  bcdlen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       bcd);

  temp8alen = scale_expansion_zeroelim(4, de, pc[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ce, -pd[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, cd, pe[2], temp8a);
  cdelen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       cde);

  temp8alen = scale_expansion_zeroelim(4, ea, pd[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, da, -pe[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, de, pa[2], temp8a);
  dealen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       dea);

  temp8alen = scale_expansion_zeroelim(4, ab, pe[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, eb, -pa[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ea, pb[2], temp8a);
  eablen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       eab);

  temp8alen = scale_expansion_zeroelim(4, bd, pa[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, da, pb[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ab, pd[2], temp8a);
  abdlen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       abd);

  temp8alen = scale_expansion_zeroelim(4, ce, pb[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, eb, pc[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, bc, pe[2], temp8a);
  bcelen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       bce);

  temp8alen = scale_expansion_zeroelim(4, da, pc[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, pd[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, cd, pa[2], temp8a);
  cdalen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       cda);

  temp8alen = scale_expansion_zeroelim(4, eb, pd[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, pe[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, de, pb[2], temp8a);
  deblen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       deb);

  temp8alen = scale_expansion_zeroelim(4, ac, pe[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ce, pa[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ea, pc[2], temp8a);
  eaclen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       eac);

  temp48alen = fast_expansion_sum_zeroelim(cdelen, cde, bcelen, bce, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(deblen, deb, bcdlen, bcd, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  bcdelen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, bcde);
  xlen = scale_expansion_zeroelim(bcdelen, bcde, pa[0], temp192);
  xlen = scale_expansion_zeroelim(xlen, temp192, pa[0], det384x);
  ylen = scale_expansion_zeroelim(bcdelen, bcde, pa[1], temp192);
  ylen = scale_expansion_zeroelim(ylen, temp192, pa[1], det384y);
  zlen = scale_expansion_zeroelim(bcdelen, bcde, pa[2], temp192);
  zlen = scale_expansion_zeroelim(zlen, temp192, pa[2], det384z);
  xylen = fast_expansion_sum_zeroelim(xlen, det384x, ylen, det384y, detxy);
  alen = fast_expansion_sum_zeroelim(xylen, detxy, zlen, det384z, adet);

  temp48alen = fast_expansion_sum_zeroelim(dealen, dea, cdalen, cda, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(eaclen, eac, cdelen, cde, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  cdealen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, cdea);
  xlen = scale_expansion_zeroelim(cdealen, cdea, pb[0], temp192);
  xlen = scale_expansion_zeroelim(xlen, temp192, pb[0], det384x);
  ylen = scale_expansion_zeroelim(cdealen, cdea, pb[1], temp192);
  ylen = scale_expansion_zeroelim(ylen, temp192, pb[1], det384y);
  zlen = scale_expansion_zeroelim(cdealen, cdea, pb[2], temp192);
  zlen = scale_expansion_zeroelim(zlen, temp192, pb[2], det384z);
  xylen = fast_expansion_sum_zeroelim(xlen, det384x, ylen, det384y, detxy);
  blen = fast_expansion_sum_zeroelim(xylen, detxy, zlen, det384z, bdet);

  temp48alen = fast_expansion_sum_zeroelim(eablen, eab, deblen, deb, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(abdlen, abd, dealen, dea, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  deablen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, deab);
  xlen = scale_expansion_zeroelim(deablen, deab, pc[0], temp192);
  xlen = scale_expansion_zeroelim(xlen, temp192, pc[0], det384x);
  ylen = scale_expansion_zeroelim(deablen, deab, pc[1], temp192);
  ylen = scale_expansion_zeroelim(ylen, temp192, pc[1], det384y);
  zlen = scale_expansion_zeroelim(deablen, deab, pc[2], temp192);
  zlen = scale_expansion_zeroelim(zlen, temp192, pc[2], det384z);
  xylen = fast_expansion_sum_zeroelim(xlen, det384x, ylen, det384y, detxy);
  clen = fast_expansion_sum_zeroelim(xylen, detxy, zlen, det384z, cdet);

  temp48alen = fast_expansion_sum_zeroelim(abclen, abc, eaclen, eac, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(bcelen, bce, eablen, eab, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  eabclen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, eabc);
  xlen = scale_expansion_zeroelim(eabclen, eabc, pd[0], temp192);
  xlen = scale_expansion_zeroelim(xlen, temp192, pd[0], det384x);
  ylen = scale_expansion_zeroelim(eabclen, eabc, pd[1], temp192);
  ylen = scale_expansion_zeroelim(ylen, temp192, pd[1], det384y);
  zlen = scale_expansion_zeroelim(eabclen, eabc, pd[2], temp192);
  zlen = scale_expansion_zeroelim(zlen, temp192, pd[2], det384z);
  xylen = fast_expansion_sum_zeroelim(xlen, det384x, ylen, det384y, detxy);
  dlen = fast_expansion_sum_zeroelim(xylen, detxy, zlen, det384z, ddet);

  temp48alen = fast_expansion_sum_zeroelim(bcdlen, bcd, abdlen, abd, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(cdalen, cda, abclen, abc, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  abcdlen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, abcd);
  xlen = scale_expansion_zeroelim(abcdlen, abcd, pe[0], temp192);
  xlen = scale_expansion_zeroelim(xlen, temp192, pe[0], det384x);
  ylen = scale_expansion_zeroelim(abcdlen, abcd, pe[1], temp192);
  ylen = scale_expansion_zeroelim(ylen, temp192, pe[1], det384y);
  zlen = scale_expansion_zeroelim(abcdlen, abcd, pe[2], temp192);
  zlen = scale_expansion_zeroelim(zlen, temp192, pe[2], det384z);
  xylen = fast_expansion_sum_zeroelim(xlen, det384x, ylen, det384y, detxy);
  elen = fast_expansion_sum_zeroelim(xylen, detxy, zlen, det384z, edet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  cdelen = fast_expansion_sum_zeroelim(cdlen, cddet, elen, edet, cdedet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, cdelen, cdedet, deter);

  return deter[deterlen - 1];
}